

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTexCubeCase::iterate(UploadTexCubeCase *this)

{
  int *piVar1;
  RenderContext *context;
  code *pcVar2;
  pointer pPVar3;
  pointer pcVar4;
  TestContext *testCtx;
  undefined8 uVar5;
  pointer pfVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureFormat TVar12;
  void *__dest;
  undefined4 extraout_var_03;
  TestError *this_00;
  long lVar13;
  char *description;
  int faceNdx_1;
  long lVar14;
  int x;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar15;
  GenericVec4 *pGVar16;
  int faceNdx;
  long lVar17;
  int iVar18;
  deUint8 indices [6];
  undefined2 uStack_552;
  undefined4 auStack_550 [2];
  undefined8 local_548;
  undefined2 local_540;
  undefined1 local_53e;
  TextureFormat local_538;
  pointer local_530;
  PixelFormat local_528;
  long local_518;
  undefined2 local_510;
  undefined1 local_50e;
  ConstPixelBufferAccess srcLevel;
  float positions [8];
  size_type __dnew_1;
  int iStack_480;
  vector<float,_std::allocator<float>_> texCoord;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  ReferenceParams sampleParams;
  undefined1 local_348 [32];
  TextureLevel result;
  ShaderProgram program;
  ConstPixelBufferAccess *local_1c0;
  ConstPixelBufferAccess *pCStack_1b8;
  ConstPixelBufferAccess *local_1b0;
  TextureCube texData;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*context->_vptr_RenderContext[3])(context);
  lVar14 = CONCAT44(extraout_var,iVar8);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar8 = (*context->_vptr_RenderContext[3])(context);
  pOVar11 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&fbo.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar8),pOVar11);
  iVar8 = (*context->_vptr_RenderContext[3])(context);
  pOVar11 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&colorBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar8),pOVar11);
  iVar8 = (*context->_vptr_RenderContext[3])();
  pOVar11 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&depthStencilTex.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar8),
             pOVar11);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)glu::mapGLInternalFormat(this->m_format);
  tcu::TextureCube::TextureCube(&texData,(TextureFormat *)&program,0x40);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x300000008;
  tcu::TextureLevel::TextureLevel(&result,(TextureFormat *)&program,0x80,0x80,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  iVar8 = 0;
  pvVar15 = texData.m_access;
  lVar17 = 0;
  do {
    tcu::TextureCube::allocLevel(&texData,(CubeFace)lVar17,0);
    tcu::clearStencil((pvVar15->
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      )._M_impl.super__Vector_impl_data._M_start,iVar8);
    lVar17 = lVar17 + 1;
    iVar8 = iVar8 + 0x2a;
    pvVar15 = pvVar15 + 1;
  } while (lVar17 != 6);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xbfa66666bfc00000;
  sampleParams.super_RenderParams.texType = 0x3fa66666;
  sampleParams.super_RenderParams.samplerType = 0x3fb33333;
  glu::TextureTestUtil::computeQuadTexCoordCube
            (&texCoord,CUBEFACE_NEGATIVE_X,(Vec2 *)&program,(Vec2 *)&sampleParams);
  (**(code **)(lVar14 + 0xb8))(0x8513,depthStencilTex.super_ObjectWrapper.m_object);
  (**(code **)(lVar14 + 0x1380))(0x8513,1,this->m_format);
  lVar17 = 0;
  pvVar15 = texData.m_access;
  do {
    dVar9 = glu::getGLCubeFace((CubeFace)lVar17);
    glu::texSubImage2D(context,dVar9,0,0,0,
                       &((pvVar15->
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess);
    lVar17 = lVar17 + 1;
    pvVar15 = pvVar15 + 1;
  } while (lVar17 != 6);
  dVar9 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar9,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x2b9);
  (**(code **)(lVar14 + 0xa0))(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (**(code **)(lVar14 + 0x1238))(0x8d41,0x8058,0x80,0x80);
  (**(code **)(lVar14 + 0x78))(0x8d40,fbo.super_ObjectWrapper.m_object);
  (**(code **)(lVar14 + 0x688))(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(*(Functions **)(lVar14 + 0x170));
  pfVar6 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  memset(&sampleParams,0,0xac);
  local_348._0_8_ = (pointer)0x0;
  local_348[8] = 0;
  local_348._9_7_ = 0;
  local_348[0x10] = 0;
  local_348._17_8_ = 0;
  _indices = (TextureFormat)&local_548;
  positions[0] = 2.36819e-43;
  positions[1] = 0.0;
  TVar12 = (TextureFormat)std::__cxx11::string::_M_create((ulong *)indices,(ulong)positions);
  uVar5 = positions._0_8_;
  local_548._0_4_ = positions[0];
  local_548._4_4_ = positions[1];
  _indices = TVar12;
  memcpy((void *)TVar12,
         "#version 300 es\nin highp vec4 a_position;\nin highp vec3 a_texCoord;\nout highp vec3 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
         ,0xa9);
  *(undefined1 *)((long)TVar12 + uVar5) = 0;
  srcLevel.m_format = (TextureFormat)((ulong)srcLevel.m_format.type << 0x20);
  piVar1 = srcLevel.m_pitch.m_data + 1;
  srcLevel.m_size.m_data._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&srcLevel.m_size,_indices,uVar5 + (long)_indices);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&sampleParams.super_RenderParams.w +
                 ((ulong)srcLevel.m_format & 0xffffffff) * 0x18 + -0xc),
              (value_type *)&srcLevel.m_size);
  local_530 = pfVar6;
  __dnew_1._0_4_ = 0xf4;
  __dnew_1._4_4_ = 0;
  local_528._0_8_ = &local_518;
  __dest = (void *)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&__dnew_1);
  iVar18 = __dnew_1._4_4_;
  iVar8 = (int)__dnew_1;
  local_528.redBits = (int)__dest;
  local_528.greenBits = (int)((ulong)__dest >> 0x20);
  lVar14 = CONCAT44(__dnew_1._4_4_,(int)__dnew_1);
  local_518 = lVar14;
  memcpy(__dest,
         "#version 300 es\nuniform highp usamplerCube u_sampler;\nin highp vec3 v_texCoord;\nlayout(location = 0) out highp vec4 o_color;\nvoid main (void)\n{\n\to_color.x = float(texture(u_sampler, v_texCoord).x) / 255.0;\n\to_color.yzw = vec3(0.0, 0.0, 1.0);\n}\n"
         ,0xf4);
  local_528.blueBits = iVar8;
  local_528.alphaBits = iVar18;
  *(undefined1 *)((long)__dest + lVar14) = 0;
  positions[0] = 1.4013e-45;
  positions._8_8_ = positions + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(positions + 2),CONCAT44(local_528.greenBits,local_528.redBits),
             CONCAT44(iVar18,iVar8) + CONCAT44(local_528.greenBits,local_528.redBits));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&sampleParams.super_RenderParams.w +
                 (positions._0_8_ & 0xffffffff) * 0x18 + -0xc),(value_type *)(positions + 2));
  glu::ShaderProgram::ShaderProgram(&program,context,(ProgramSources *)&sampleParams);
  if ((float *)positions._8_8_ != positions + 6) {
    operator_delete((void *)positions._8_8_,positions._24_8_ + 1);
  }
  if ((long *)CONCAT44(local_528.greenBits,local_528.redBits) != &local_518) {
    operator_delete((long *)CONCAT44(local_528.greenBits,local_528.redBits),local_518 + 1);
  }
  if ((int *)srcLevel.m_size.m_data._0_8_ != piVar1) {
    operator_delete((void *)srcLevel.m_size.m_data._0_8_,
                    CONCAT17(srcLevel.m_pitch.m_data[2]._3_1_,
                             CONCAT16(srcLevel.m_pitch.m_data[2]._2_1_,
                                      CONCAT24((undefined2)srcLevel.m_pitch.m_data[2],
                                               srcLevel.m_pitch.m_data[1]))) + 1);
  }
  if (_indices != (TextureFormat)&local_548) {
    operator_delete((void *)_indices,local_548 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &sampleParams.maxLevel);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)sampleParams.super_RenderParams.w.m_data + lVar14 + -0xc));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  positions[4] = 1.0;
  positions[5] = -1.0;
  positions[6] = 1.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = -1.0;
  positions[3] = 1.0;
  local_548 = 0x697469736f705f61;
  local_540 = 0x6e6f;
  local_53e = 0;
  srcLevel.m_format.order = A;
  _indices = (TextureFormat)&local_548;
  srcLevel.m_size.m_data._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&srcLevel.m_size,&local_548);
  sampleParams.super_RenderParams.texType = srcLevel.m_format.order;
  sampleParams.super_RenderParams._8_8_ = sampleParams.super_RenderParams.w.m_data + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sampleParams.super_RenderParams.flags,srcLevel.m_size.m_data._0_8_,
             CONCAT26(srcLevel.m_pitch.m_data[0]._2_2_,srcLevel._16_6_) +
             srcLevel.m_size.m_data._0_8_);
  sampleParams.super_RenderParams.colorScale.m_data[1] = 0.0;
  sampleParams.super_RenderParams.colorScale.m_data[3] = 1.12104e-44;
  sampleParams.super_RenderParams.colorBias.m_data[0] = 0.0;
  sampleParams.super_RenderParams.colorBias.m_data[1] = 2.8026e-45;
  sampleParams.super_RenderParams.colorBias.m_data[2] = 5.60519e-45;
  sampleParams.super_RenderParams.colorBias.m_data[3] = 0.0;
  sampleParams.sampler._4_8_ = positions;
  if ((int *)srcLevel.m_size.m_data._0_8_ != piVar1) {
    operator_delete((void *)srcLevel.m_size.m_data._0_8_,
                    CONCAT17(srcLevel.m_pitch.m_data[2]._3_1_,
                             CONCAT16(srcLevel.m_pitch.m_data[2]._2_1_,
                                      CONCAT24((undefined2)srcLevel.m_pitch.m_data[2],
                                               srcLevel.m_pitch.m_data[1]))) + 1);
  }
  local_518 = 0x6f6f437865745f61;
  local_510 = 0x6472;
  local_528.blueBits = 10;
  local_528.alphaBits = 0;
  local_50e = 0;
  srcLevel.m_format.order = A;
  srcLevel.m_size.m_data._0_8_ = piVar1;
  local_528._0_8_ = &local_518;
  std::__cxx11::string::_M_construct<char*>((string *)&srcLevel.m_size,&local_518);
  sampleParams.sampler.minFilter = srcLevel.m_format.order;
  pGVar16 = &sampleParams.sampler.borderColor;
  sampleParams.sampler._20_8_ = pGVar16;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sampleParams.sampler.lodThreshold,srcLevel.m_size.m_data._0_8_,
             CONCAT26(srcLevel.m_pitch.m_data[0]._2_2_,srcLevel._16_6_) +
             srcLevel.m_size.m_data._0_8_);
  sampleParams.sampler.seamlessCubeMap = false;
  sampleParams.sampler._53_3_ = 0;
  sampleParams.lodMode = 8;
  sampleParams.minLod = 0.0;
  sampleParams.maxLod = 4.2039e-45;
  sampleParams.baseLevel = 4;
  sampleParams.maxLevel = 0;
  if ((int *)srcLevel.m_size.m_data._0_8_ != piVar1) {
    operator_delete((void *)srcLevel.m_size.m_data._0_8_,
                    CONCAT17(srcLevel.m_pitch.m_data[2]._3_1_,
                             CONCAT16(srcLevel.m_pitch.m_data[2]._2_1_,
                                      CONCAT24((undefined2)srcLevel.m_pitch.m_data[2],
                                               srcLevel.m_pitch.m_data[1]))) + 1);
  }
  if ((long *)local_528._0_8_ != &local_518) {
    operator_delete((void *)local_528._0_8_,local_518 + 1);
  }
  if (_indices != (TextureFormat)&local_548) {
    operator_delete((void *)_indices,local_548 + 1);
  }
  indices[0] = '\0';
  indices[1] = '\0';
  indices[2] = '\0';
  indices[3] = '\0';
  indices[4] = '\x01';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x01';
  indices[2] = '\x02';
  indices[3] = '\x02';
  iVar8 = (*context->_vptr_RenderContext[3])(context);
  lVar14 = CONCAT44(extraout_var_03,iVar8);
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar14 + 8))(0x84c0);
    (**(code **)(lVar14 + 0xb8))(0x8513,depthStencilTex.super_ObjectWrapper.m_object);
    (**(code **)(lVar14 + 0x1360))(0x8513,0x2801,0x2600);
    (**(code **)(lVar14 + 0x1360))(0x8513,0x2800,0x2600);
    (**(code **)(lVar14 + 0x1360))(0x8513,0x90ea,0x1901);
    dVar9 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar9,"Texture state setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x179);
    (**(code **)(lVar14 + 0x1680))(program.m_program.m_program);
    pcVar2 = *(code **)(lVar14 + 0x14f0);
    uVar10 = (**(code **)(lVar14 + 0xb48))(program.m_program.m_program,"u_sampler");
    (*pcVar2)(uVar10,0);
    dVar9 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar9,"Program setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x17d);
    (**(code **)(lVar14 + 0x1a00))(0,0,0x80,0x80);
    srcLevel.m_format.order = R;
    srcLevel.m_format.type = UNORM_INT32;
    srcLevel.m_size.m_data._0_8_ = srcLevel.m_size.m_data._0_8_ & 0xffffffff00000000;
    srcLevel._16_6_ = SUB86(indices,0);
    srcLevel.m_pitch.m_data[0]._2_2_ = (undefined2)((ulong)indices >> 0x30);
    glu::draw(context,program.m_program.m_program,2,(VertexArrayBinding *)&sampleParams,
              (PrimitiveList *)&srcLevel,(DrawUtilCallback *)0x0);
    lVar14 = -0xa0;
    do {
      if (pGVar16 != (GenericVec4 *)*(undefined1 **)(pGVar16 + -1)) {
        operator_delete(*(undefined1 **)(pGVar16 + -1),*(long *)&pGVar16->v + 1);
      }
      pGVar16 = pGVar16 + -5;
      lVar14 = lVar14 + 0x50;
    } while (lVar14 != 0);
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&program,&result);
    glu::readPixels(context,0,0,(PixelBufferAccess *)&program);
    sampleParams.super_RenderParams.texType = TEXTURETYPE_2D;
    sampleParams.super_RenderParams.samplerType = SAMPLERTYPE_SHADOW;
    tcu::TextureCube::TextureCube((TextureCube *)&program,(TextureFormat *)&sampleParams,0x40);
    srcLevel.m_format.order = R;
    srcLevel.m_format.type = SNORM_INT8;
    srcLevel.m_size.m_data[0] = 0;
    srcLevel.m_size.m_data[1] = 0;
    srcLevel._16_6_ = 0;
    srcLevel.m_pitch.m_data[0]._2_2_ = 0;
    srcLevel.m_pitch.m_data[1] = CONCAT31(srcLevel.m_pitch.m_data[1]._1_3_,1);
    srcLevel.m_pitch.m_data[2]._0_2_ = 0;
    srcLevel.m_pitch.m_data[2]._2_1_ = 0;
    srcLevel.m_pitch.m_data[2]._3_1_ = 0;
    srcLevel.m_data._0_4_ = R;
    srcLevel.m_data._4_4_ = SNORM_INT8;
    glu::TextureTestUtil::ReferenceParams::ReferenceParams
              (&sampleParams,TEXTURETYPE_CUBE,(Sampler *)&srcLevel,LODMODE_EXACT);
    positions[0] = 3.08286e-44;
    positions[1] = 3.08286e-44;
    positions[2] = 3.08286e-44;
    positions[3] = 2.24208e-44;
    positions[4] = 2.24208e-44;
    positions[5] = 2.24208e-44;
    __dnew_1._0_4_ = 0;
    indices[0] = '\b';
    indices[1] = '\0';
    indices[2] = '\0';
    indices[3] = '\0';
    stack0xfffffffffffffaac = UNORM_SHORT_565;
    tcu::computeFixedPointThreshold((tcu *)&srcLevel,(IVec4 *)indices);
    positions[6] = (float)srcLevel.m_format.order;
    positions[7] = (float)srcLevel.m_format.type;
    positions[0] = 3.08286e-44;
    positions[1] = 3.08286e-44;
    positions[2] = 3.08286e-44;
    positions[3] = 7.00649e-45;
    __dnew_1._4_4_ = 0x10;
    iStack_480 = 7;
    positions[4] = 7.00649e-45;
    positions[5] = 0.0;
    if (0 < (int)((ulong)((long)texData.m_access[0].
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)texData.m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
      local_530 = (pointer)0x0;
      lVar14 = 0;
      do {
        lVar17 = 0;
        do {
          if (texData.m_data[lVar17].
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].m_cap != 0) {
            tcu::TextureCube::allocLevel((TextureCube *)&program,(CubeFace)lVar17,(int)lVar14);
            pPVar3 = texData.m_access[lVar17].
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            srcLevel.m_format = *(TextureFormat *)(pPVar3 + lVar14);
            lVar13 = 2;
            do {
              srcLevel.m_size.m_data[lVar13 + -2] =
                   *(int *)((long)local_530 +
                           (long)((pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar13 + -2
                                 ));
              lVar13 = lVar13 + 1;
            } while (lVar13 != 5);
            lVar13 = 5;
            do {
              srcLevel.m_size.m_data[lVar13 + -2] =
                   *(int *)((long)local_530 +
                           (long)((pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar13 + -2
                                 ));
              lVar13 = lVar13 + 1;
            } while (lVar13 != 8);
            TVar12 = ((TextureFormat *)(pPVar3 + lVar14))[4];
            srcLevel.m_data._0_4_ = TVar12.order;
            srcLevel.m_data._4_4_ = TVar12.type;
            pcVar4 = (&program.m_program.m_info.infoLog._M_dataplus)[lVar17 * 3]._M_p;
            _indices = *(TextureFormat *)(pcVar4 + lVar14 * 0x28);
            lVar13 = 2;
            do {
              *(undefined4 *)(indices + lVar13 * 4) =
                   *(undefined4 *)((long)local_530 + (long)(pcVar4 + lVar13 * 4));
              lVar13 = lVar13 + 1;
            } while (lVar13 != 5);
            lVar13 = 5;
            do {
              *(undefined4 *)(indices + lVar13 * 4) =
                   *(undefined4 *)((long)local_530 + (long)(pcVar4 + lVar13 * 4));
              lVar13 = lVar13 + 1;
            } while (lVar13 != 8);
            local_538 = ((TextureFormat *)(pcVar4 + lVar14 * 0x28))[4];
            if (0 < texData.m_size) {
              iVar18 = 0;
              iVar8 = texData.m_size;
              do {
                if (0 < iVar8) {
                  x = 0;
                  do {
                    iVar8 = tcu::ConstPixelBufferAccess::getPixStencil(&srcLevel,x,iVar18,0);
                    local_528.redBits = (int)((float)iVar8 / 255.0);
                    local_528.greenBits = 0;
                    local_528.blueBits = 0;
                    local_528.alphaBits = 0x3f800000;
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)indices,(Vec4 *)&local_528,x,iVar18,0);
                    x = x + 1;
                    iVar8 = texData.m_size;
                  } while (x < texData.m_size);
                }
                iVar18 = iVar18 + 1;
              } while (iVar18 < iVar8);
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 6);
        lVar14 = lVar14 + 1;
        local_530 = local_530 + 10;
      } while (lVar14 < (int)((ulong)((long)texData.m_access[0].
                                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)texData.m_access[0].
                                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x33333333);
    }
    testCtx = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)indices,&result);
    srcLevel.m_data._0_4_ = (ChannelOrder)local_1b0;
    srcLevel.m_data._4_4_ = (ChannelType)((ulong)local_1b0 >> 0x20);
    srcLevel._16_6_ = SUB86(local_1c0,0);
    srcLevel.m_pitch.m_data[0]._2_2_ = (undefined2)((ulong)local_1c0 >> 0x30);
    srcLevel.m_pitch.m_data[1] = (int)pCStack_1b8;
    srcLevel.m_pitch.m_data[2]._0_2_ = (undefined2)((ulong)pCStack_1b8 >> 0x20);
    srcLevel.m_pitch.m_data[2]._2_1_ = (undefined1)((ulong)pCStack_1b8 >> 0x30);
    srcLevel.m_pitch.m_data[2]._3_1_ = (undefined1)((ulong)pCStack_1b8 >> 0x38);
    local_528.redBits = 8;
    local_528.greenBits = 8;
    local_528.blueBits = 8;
    local_528.alphaBits = 8;
    bVar7 = glu::TextureTestUtil::verifyTextureResult
                      (testCtx,(ConstPixelBufferAccess *)indices,(TextureCubeView *)&srcLevel,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,&sampleParams,(LookupPrecision *)positions,
                       (LodPrecision *)&__dnew_1,&local_528);
    description = "Image comparison failed";
    if (bVar7) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar7,
               description);
    tcu::TextureCube::~TextureCube((TextureCube *)&program);
    tcu::TextureLevel::~TextureLevel(&result);
    tcu::TextureCube::~TextureCube(&texData);
    glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  srcLevel.m_format = (TextureFormat)(srcLevel.m_size.m_data + 2);
  srcLevel._16_6_ = 0x6c69706d6f43;
  srcLevel.m_pitch.m_data[0]._2_2_ = 0x2065;
  srcLevel.m_pitch.m_data[1] = 0x6c696166;
  srcLevel.m_pitch.m_data[2]._0_2_ = 0x6465;
  srcLevel.m_size.m_data[0] = 0xe;
  srcLevel.m_size.m_data[1] = 0;
  srcLevel.m_pitch.m_data[2]._2_1_ = 0;
  tcu::TestError::TestError(this_00,(string *)&srcLevel);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					size				= 64;
		const int					renderWidth			= 128;
		const int					renderHeight		= 128;
		vector<float>				texCoord;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		tcu::TextureCube			texData				(glu::mapGLInternalFormat(m_format), size);
		tcu::TextureLevel			result				(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), renderWidth, renderHeight);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
			const int				stencilVal	= 42*faceNdx;

			texData.allocLevel(face, 0);
			tcu::clearStencil(texData.getLevelFace(0, face), stencilVal);
		}

		glu::TextureTestUtil::computeQuadTexCoordCube(texCoord, tcu::CUBEFACE_NEGATIVE_X, Vec2(-1.5f, -1.3f), Vec2(1.3f, 1.4f));

		gl.bindTexture(GL_TEXTURE_CUBE_MAP, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_CUBE_MAP, 1, m_format, size, size);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
			glu::texSubImage2D(renderCtx, glu::getGLCubeFace(tcu::CubeFace(faceNdx)), 0, 0, 0, texData.getLevelFace(0, tcu::CubeFace(faceNdx)));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, renderWidth, renderHeight);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColorCube(renderCtx, *depthStencilTex, &texCoord[0], renderWidth, renderHeight);
		glu::readPixels(renderCtx, 0, 0, result);

		{
			using namespace glu::TextureTestUtil;

			tcu::TextureCube		redTex			(TextureFormat(TextureFormat::R, TextureFormat::UNORM_INT8), size);
			const ReferenceParams	sampleParams	(TEXTURETYPE_CUBE, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::NEAREST,
																					tcu::Sampler::NEAREST));
			tcu::LookupPrecision	lookupPrec;
			tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
			bool					compareOk;

			lookupPrec.colorMask		= tcu::BVec4(true, true, true, true);
			lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(IVec4(8, 8, 8, 8));
			lookupPrec.coordBits		= tcu::IVec3(22, 22, 22);
			lookupPrec.uvwBits			= tcu::IVec3(5, 5, 0);
			lodPrec.lodBits				= 7;
			lodPrec.derivateBits		= 16;

			stencilToUnorm8(texData, redTex);

			compareOk = verifyTextureResult(m_testCtx, result, redTex, &texCoord[0], sampleParams, lookupPrec, lodPrec, tcu::PixelFormat(8, 8, 8, 8));

			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}